

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::CheckerMemberVisitor::handle(CheckerMemberVisitor *this,ProceduralBlockSymbol *symbol)

{
  if ((symbol->procedureKind != Final) && (symbol->isFromAssertion == false)) {
    if (symbol->procedureKind == Always) {
      Scope::addDiag(&this->body->super_Scope,(DiagCode)0x6,(symbol->super_Symbol).location);
      return;
    }
    this->currBlock = symbol;
    ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
    visitDefault<slang::ast::ProceduralBlockSymbol>
              ((ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *)this,symbol
              );
    this->currBlock = (ProceduralBlockSymbol *)0x0;
  }
  return;
}

Assistant:

void handle(const ProceduralBlockSymbol& symbol) {
        // Everything is allowed in final blocks, and implicit procedures created
        // for assertions should be ignored.
        if (symbol.procedureKind == ProceduralBlockKind::Final || symbol.isFromAssertion)
            return;

        if (symbol.procedureKind == ProceduralBlockKind::Always) {
            body.addDiag(diag::AlwaysInChecker, symbol.location);
            return;
        }

        SLANG_ASSERT(!currBlock);
        currBlock = &symbol;
        visitDefault(symbol);
        currBlock = nullptr;
    }